

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeDPRRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  undefined1 extraout_DL;
  undefined1 uVar3;
  undefined1 extraout_DL_00;
  undefined7 extraout_var;
  undefined7 uVar4;
  undefined7 extraout_var_00;
  DecodeStatus DVar5;
  uint RegNo;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  
  RegNo = Val >> 8 & 0x1f;
  uVar6 = Val >> 1 & 0x7f;
  bVar9 = uVar6 - 0x11 < 0xfffffff0;
  Decoder_00 = (void *)CONCAT71((int7)((ulong)Decoder >> 8),bVar9);
  uVar1 = RegNo + uVar6;
  if (0x20 < uVar1 || bVar9) {
    Decoder_00 = (void *)(ulong)(0x20 - RegNo);
    if (0x20 < uVar1) {
      uVar6 = 0x20 - RegNo;
    }
    uVar7 = uVar6 + (uVar6 == 0);
    uVar6 = 0x10;
    if (uVar7 < 0x10) {
      uVar6 = uVar7;
    }
    DVar5 = MCDisassembler_SoftFail;
  }
  else {
    DVar5 = MCDisassembler_Success;
  }
  DVar2 = DecodeDPRRegisterClass
                    (Inst,RegNo,CONCAT71((int7)(Address >> 8),0x20 < uVar1 || bVar9),Decoder_00);
  if (DVar2 != MCDisassembler_Success) {
    if (DVar2 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    DVar5 = MCDisassembler_SoftFail;
  }
  iVar8 = uVar6 - 1;
  uVar3 = extraout_DL;
  uVar4 = extraout_var;
  while( true ) {
    do {
      RegNo = RegNo + 1;
      bVar9 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      if (bVar9) {
        return DVar5;
      }
      DVar2 = DecodeDPRRegisterClass(Inst,RegNo,CONCAT71(uVar4,uVar3),Decoder_00);
      uVar3 = extraout_DL_00;
      uVar4 = extraout_var_00;
    } while (DVar2 == MCDisassembler_Success);
    if (DVar2 != MCDisassembler_SoftFail) break;
    DVar5 = MCDisassembler_SoftFail;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeDPRRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned i;
	unsigned Vd = fieldFromInstruction_4(Val, 8, 5);
	unsigned regs = fieldFromInstruction_4(Val, 1, 7);

	// In case of unpredictable encoding, tweak the operands.
	if (regs == 0 || regs > 16 || (Vd + regs) > 32) {
		regs = Vd + regs > 32 ? 32 - Vd : regs;
		regs = (1u > regs? 1u : regs);
		regs = (16u > regs? regs : 16u);
		S = MCDisassembler_SoftFail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;

	for (i = 0; i < (regs - 1); ++i) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, ++Vd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}